

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void Excel::Parser::handleRK(Record *record,size_t sheetIdx,IStorage *storage)

{
  Stream *pSVar1;
  long *in_RDX;
  undefined8 in_RSI;
  Record *in_RDI;
  int32_t in_stack_00000014;
  uint *in_stack_00000018;
  Stream *in_stack_00000020;
  uint32_t rk;
  int16_t column;
  int16_t row;
  
  Record::dataStream(in_RDI);
  Stream::read<short>(in_stack_00000020,(short *)in_stack_00000018,in_stack_00000014);
  Record::dataStream(in_RDI);
  Stream::read<short>(in_stack_00000020,(short *)in_stack_00000018,in_stack_00000014);
  pSVar1 = Record::dataStream(in_RDI);
  (*pSVar1->_vptr_Stream[4])(pSVar1,2,1);
  Record::dataStream(in_RDI);
  Stream::read<unsigned_int>(in_stack_00000020,in_stack_00000018,in_stack_00000014);
  doubleFromRK(0);
  (**(code **)(*in_RDX + 0x38))(in_RDX,in_RSI,0,0);
  return;
}

Assistant:

inline void
Parser::handleRK( Record & record, size_t sheetIdx, IStorage & storage )
{
	int16_t row = 0;
	int16_t column = 0;
	uint32_t rk = 0;

	record.dataStream().read( row, 2 );
	record.dataStream().read( column, 2 );

	record.dataStream().seek( 2, Stream::FromCurrent );
	record.dataStream().read( rk, 4 );

	storage.onCell( sheetIdx, row, column, doubleFromRK( rk ) );
}